

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBegin_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params *params,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  ZSTD_paramSwitch_e ZVar1;
  U32 UVar2;
  void *pvVar3;
  void *pvVar4;
  U32 *pUVar5;
  U32 *pUVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  BYTE *pBVar18;
  BYTE *pBVar19;
  ZSTD_compressionParameters cPar;
  U32 UVar20;
  undefined4 in_EAX;
  U32 end;
  int iVar21;
  size_t sVar22;
  ulong uVar23;
  size_t sVar24;
  size_t sVar25;
  long lVar26;
  byte bVar27;
  ZSTD_matchState_t *dstMatchState;
  ZSTD_compressedBlockState_t *__dest;
  size_t tagTableSize;
  size_t sVar28;
  long lVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar36;
  uint uVar37;
  undefined1 in_XMM1 [16];
  undefined1 auVar35 [16];
  uint uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  uint uStack_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  ZSTD_strategy ZStack_110;
  ZSTD_CCtx_params local_100;
  
  sVar22 = dictSize;
  if (cdict != (ZSTD_CDict *)0x0) {
    sVar22 = cdict->dictContentSize;
  }
  uVar30 = (params->cParams).windowLog - 0x20;
  uVar31 = (params->cParams).chainLog - 0x1f;
  uVar32 = (params->cParams).hashLog - 0x1f;
  uVar33 = (params->cParams).searchLog - 0x1f;
  auVar35 = pmovsxbd(in_XMM1,0xe1e6e6e9);
  uVar34 = auVar35._0_4_;
  uVar36 = auVar35._4_4_;
  uVar37 = auVar35._8_4_;
  uVar38 = auVar35._12_4_;
  auVar35._0_4_ = -(uint)(((uVar30 < uVar34) * uVar30 | (uVar30 >= uVar34) * uVar34) == uVar30);
  auVar35._4_4_ = -(uint)(((uVar31 < uVar36) * uVar31 | (uVar31 >= uVar36) * uVar36) == uVar31);
  auVar35._8_4_ = -(uint)(((uVar32 < uVar37) * uVar32 | (uVar32 >= uVar37) * uVar37) == uVar32);
  auVar35._12_4_ = -(uint)(((uVar33 < uVar38) * uVar33 | (uVar33 >= uVar38) * uVar38) == uVar33);
  iVar21 = movmskps(in_EAX,auVar35);
  if ((((iVar21 != 0) || (4 < (params->cParams).minMatch - 3)) ||
      (0x20000 < (params->cParams).targetLength)) || (8 < (params->cParams).strategy - ZSTD_fast)) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params->cParams))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x644f,
                  "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                 );
  }
  if (dict != (void *)0x0 && cdict != (ZSTD_CDict *)0x0) {
    __assert_fail("!((dict) && (cdict))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x6450,
                  "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                 );
  }
  if ((((cdict == (ZSTD_CDict *)0x0) || (sVar24 = cdict->dictContentSize, sVar24 == 0)) ||
      (((0x1ffff < pledgedSrcSize &&
        ((pledgedSrcSize != 0xffffffffffffffff && (sVar24 * 6 <= pledgedSrcSize)))) &&
       (cdict->compressionLevel != 0)))) || (params->attachDictPref == ZSTD_dictForceLoad)) {
    sVar24 = ZSTD_resetCCtx_internal(cctx,params,pledgedSrcSize,sVar22,ZSTDcrp_makeClean,zbuff);
    if (0xffffffffffffff88 < sVar24) {
      return sVar24;
    }
    if (cdict == (ZSTD_CDict *)0x0) {
      uVar39 = SUB84(cctx->entropyWorkspace,0);
      uVar40 = (undefined4)((ulong)cctx->entropyWorkspace >> 0x20);
    }
    else {
      dict = cdict->dictContent;
      dictContentType = cdict->dictContentType;
      uVar39 = SUB84(cctx->entropyWorkspace,0);
      uVar40 = (undefined4)((ulong)cctx->entropyWorkspace >> 0x20);
      dictSize = cdict->dictContentSize;
    }
    sVar24 = ZSTD_compress_insertDictionary
                       ((cctx->blockState).prevCBlock,&(cctx->blockState).matchState,&cctx->ldmState
                        ,&cctx->workspace,&cctx->appliedParams,dict,dictSize,dictContentType,dtlm,
                        ZSTD_tfp_forCCtx,(void *)CONCAT44(uVar40,uVar39));
    if (0xffffffffffffff88 < sVar24) {
      return sVar24;
    }
    if (sVar24 >> 0x20 != 0) {
      __assert_fail("dictID <= UINT_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x6469,
                    "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                   );
    }
    cctx->dictID = (U32)sVar24;
    cctx->dictContentSize = sVar22;
  }
  else {
    iVar21 = ZSTD_shouldAttachDict(cdict,params,pledgedSrcSize);
    if (iVar21 == 0) {
      memcpy(&local_100,params,0xd0);
      if ((cdict->matchState).dedicatedDictSearch != 0) {
        __assert_fail("!cdict->matchState.dedicatedDictSearch",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x59eb,
                      "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                     );
      }
      if (local_100.cParams.windowLog == 0) {
        __assert_fail("windowLog != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x59f0,
                      "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                     );
      }
      uVar14 = (cdict->matchState).cParams.chainLog;
      uVar15 = (cdict->matchState).cParams.hashLog;
      uVar16 = (cdict->matchState).cParams.searchLog;
      uVar17 = (cdict->matchState).cParams.minMatch;
      local_100.cParams.targetLength = (cdict->matchState).cParams.targetLength;
      local_100.cParams.strategy = (cdict->matchState).cParams.strategy;
      local_100.cParams.chainLog = uVar14;
      ZVar1 = cdict->useRowMatchFinder;
      local_100.cParams.hashLog = uVar15;
      local_100.cParams.searchLog = uVar16;
      local_100.cParams.minMatch = uVar17;
      local_100.useRowMatchFinder = ZVar1;
      sVar22 = ZSTD_resetCCtx_internal(cctx,&local_100,pledgedSrcSize,0,ZSTDcrp_leaveDirty,zbuff);
      if (0xffffffffffffff88 < sVar22) {
        return sVar22;
      }
      if ((cctx->appliedParams).cParams.strategy != (cdict->matchState).cParams.strategy) {
        __assert_fail("cctx->appliedParams.cParams.strategy == cdict_cParams->strategy",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x59f8,
                      "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                     );
      }
      if ((cctx->appliedParams).cParams.hashLog != (cdict->matchState).cParams.hashLog) {
        __assert_fail("cctx->appliedParams.cParams.hashLog == cdict_cParams->hashLog",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x59f9,
                      "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                     );
      }
      if ((cctx->appliedParams).cParams.chainLog != (cdict->matchState).cParams.chainLog) {
        __assert_fail("cctx->appliedParams.cParams.chainLog == cdict_cParams->chainLog",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x59fa,
                      "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                     );
      }
      pvVar3 = (cctx->workspace).objectEnd;
      pvVar4 = (cctx->workspace).tableValidEnd;
      if (pvVar4 < pvVar3) {
        __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x42cd,"void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *)");
      }
      if ((cctx->workspace).allocStart < pvVar4) {
        __assert_fail("ws->tableValidEnd <= ws->allocStart",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x42ce,"void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *)");
      }
      (cctx->workspace).tableValidEnd = pvVar3;
      ZSTD_cwksp_assert_internal_consistency(&cctx->workspace);
      if (ZVar1 == ZSTD_ps_auto) {
        __assert_fail("params.useRowMatchFinder != ZSTD_ps_auto",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x59fe,
                      "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                     );
      }
      lVar29 = 0;
      iVar21 = ZSTD_allocateChainTable
                         ((cdict->matchState).cParams.strategy,cdict->useRowMatchFinder,0);
      if (iVar21 != 0) {
        lVar29 = 1L << ((byte)(cdict->matchState).cParams.chainLog & 0x3f);
      }
      bVar27 = (byte)(cdict->matchState).cParams.hashLog;
      sVar28 = 1L << (bVar27 & 0x3f);
      pUVar5 = (cctx->blockState).matchState.hashTable;
      pUVar6 = (cdict->matchState).hashTable;
      if ((cdict->matchState).cParams.strategy - ZSTD_greedy < 0xfffffffe) {
        memcpy(pUVar5,pUVar6,4L << (bVar27 & 0x3f));
      }
      else {
        sVar25 = 0;
        do {
          pUVar5[sVar25] = pUVar6[sVar25] >> 8;
          sVar25 = sVar25 + 1;
        } while (sVar28 != sVar25);
      }
      iVar21 = ZSTD_allocateChainTable
                         ((cctx->appliedParams).cParams.strategy,
                          (cctx->appliedParams).useRowMatchFinder,0);
      if (iVar21 != 0) {
        pUVar5 = (cctx->blockState).matchState.chainTable;
        pUVar6 = (cdict->matchState).chainTable;
        if ((cdict->matchState).cParams.strategy - ZSTD_greedy < 0xfffffffe) {
          memcpy(pUVar5,pUVar6,lVar29 << 2);
        }
        else if (lVar29 != 0) {
          lVar26 = 0;
          do {
            pUVar5[lVar26] = pUVar6[lVar26] >> 8;
            lVar26 = lVar26 + 1;
          } while (lVar29 != lVar26);
        }
      }
      if (cdict->useRowMatchFinder == ZSTD_ps_auto) {
        __assert_fail("mode != ZSTD_ps_auto",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x519f,
                      "int ZSTD_rowMatchFinderUsed(const ZSTD_strategy, const ZSTD_paramSwitch_e)");
      }
      if ((cdict->useRowMatchFinder == ZSTD_ps_enable) &&
         (0xfffffffc < (cdict->matchState).cParams.strategy - ZSTD_btlazy2)) {
        memcpy((cctx->blockState).matchState.tagTable,(cdict->matchState).tagTable,sVar28);
        (cctx->blockState).matchState.hashSalt = (cdict->matchState).hashSalt;
      }
      if ((cdict->matchState).hashLog3 != 0) {
        __assert_fail("cdict->matchState.hashLog3 == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x5a1d,
                      "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                     );
      }
      UVar2 = (cctx->blockState).matchState.hashLog3;
      sVar28 = 0;
      if (UVar2 != 0) {
        sVar28 = 4L << ((byte)UVar2 & 0x3f);
      }
      memset((cctx->blockState).matchState.hashTable3,0,sVar28);
      pvVar3 = (cctx->workspace).tableValidEnd;
      if (pvVar3 < (cctx->workspace).objectEnd) {
        __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x42d5,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
      }
      if ((cctx->workspace).allocStart < pvVar3) {
        __assert_fail("ws->tableValidEnd <= ws->allocStart",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x42d6,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
      }
      pvVar4 = (cctx->workspace).tableEnd;
      if (pvVar3 < pvVar4) {
        (cctx->workspace).tableValidEnd = pvVar4;
      }
      ZSTD_cwksp_assert_internal_consistency(&cctx->workspace);
      uVar39 = *(undefined4 *)&(cdict->matchState).window.field_0x24;
      (cctx->blockState).matchState.window.nbOverflowCorrections =
           (cdict->matchState).window.nbOverflowCorrections;
      *(undefined4 *)&(cctx->blockState).matchState.window.field_0x24 = uVar39;
      pBVar18 = (cdict->matchState).window.nextSrc;
      pBVar19 = (cdict->matchState).window.base;
      UVar2 = (cdict->matchState).window.dictLimit;
      UVar20 = (cdict->matchState).window.lowLimit;
      (cctx->blockState).matchState.window.dictBase = (cdict->matchState).window.dictBase;
      (cctx->blockState).matchState.window.dictLimit = UVar2;
      (cctx->blockState).matchState.window.lowLimit = UVar20;
      (cctx->blockState).matchState.window.nextSrc = pBVar18;
      (cctx->blockState).matchState.window.base = pBVar19;
      UVar2 = (cdict->matchState).nextToUpdate;
      (cctx->blockState).matchState.loadedDictEnd = (cdict->matchState).loadedDictEnd;
      (cctx->blockState).matchState.nextToUpdate = UVar2;
      cctx->dictID = cdict->dictID;
      cctx->dictContentSize = cdict->dictContentSize;
      __dest = (cctx->blockState).prevCBlock;
    }
    else {
      memcpy(&local_100,params,0xd0);
      uVar7 = (cdict->matchState).cParams.windowLog;
      uVar8 = (cdict->matchState).cParams.chainLog;
      cPar.chainLog = uVar8;
      cPar.windowLog = uVar7;
      uVar9 = (cdict->matchState).cParams.hashLog;
      uVar10 = (cdict->matchState).cParams.searchLog;
      uVar11 = (cdict->matchState).cParams.minMatch;
      uVar12 = (cdict->matchState).cParams.targetLength;
      uVar13 = (cdict->matchState).cParams.strategy;
      uVar30 = local_100.cParams.windowLog;
      if (local_100.cParams.windowLog == 0) {
        __assert_fail("windowLog != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x59a1,
                      "size_t ZSTD_resetCCtx_byAttachingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                     );
      }
      uStack_120 = uVar9;
      if (((cdict->matchState).dedicatedDictSearch != 0) &&
         (uStack_120 = uVar9, uVar13 - ZSTD_greedy < 3)) {
        uStack_120 = 6;
        if (6 < uVar9 - 2) {
          uStack_120 = uVar9 - 2;
        }
      }
      cPar.hashLog = uStack_120;
      cPar.searchLog = uVar10;
      cPar.minMatch = uVar11;
      cPar.targetLength = uVar12;
      cPar.strategy = uVar13;
      ZSTD_adjustCParams_internal
                (&local_100.cParams,cPar,pledgedSrcSize,sVar24,ZSTD_cpm_attachDict,
                 local_100.useRowMatchFinder);
      local_100.cParams._0_8_ = CONCAT44(local_100.cParams.chainLog,uVar30);
      local_100.useRowMatchFinder = cdict->useRowMatchFinder;
      sVar22 = ZSTD_resetCCtx_internal(cctx,&local_100,pledgedSrcSize,0,ZSTDcrp_makeClean,zbuff);
      if (0xffffffffffffff88 < sVar22) {
        return sVar22;
      }
      if ((cctx->appliedParams).cParams.strategy != uVar13) {
        __assert_fail("cctx->appliedParams.cParams.strategy == adjusted_cdict_cParams.strategy",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x59b2,
                      "size_t ZSTD_resetCCtx_byAttachingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                     );
      }
      uVar23 = (long)(cdict->matchState).window.nextSrc - (long)(cdict->matchState).window.base;
      uVar30 = (uint)uVar23;
      if ((cdict->matchState).window.dictLimit != uVar30) {
        (cctx->blockState).matchState.dictMatchState = &cdict->matchState;
        if ((cctx->blockState).matchState.window.dictLimit < uVar30) {
          (cctx->blockState).matchState.window.nextSrc =
               (cctx->blockState).matchState.window.base + (uVar23 & 0xffffffff);
          (cctx->blockState).matchState.window.lowLimit = uVar30;
          (cctx->blockState).matchState.window.dictLimit = uVar30;
        }
        (cctx->blockState).matchState.loadedDictEnd = (cctx->blockState).matchState.window.dictLimit
        ;
      }
      cctx->dictID = cdict->dictID;
      cctx->dictContentSize = cdict->dictContentSize;
      __dest = (cctx->blockState).prevCBlock;
    }
    memcpy(__dest,&cdict->cBlockState,0x1600);
  }
  return 0;
}

Assistant:

static size_t ZSTD_compressBegin_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    const ZSTD_CCtx_params* params, U64 pledgedSrcSize,
                                    ZSTD_buffered_policy_e zbuff)
{
    size_t const dictContentSize = cdict ? cdict->dictContentSize : dictSize;
#if ZSTD_TRACE
    cctx->traceCtx = (ZSTD_trace_compress_begin != NULL) ? ZSTD_trace_compress_begin(cctx) : 0;
#endif
    DEBUGLOG(4, "ZSTD_compressBegin_internal: wlog=%u", params->cParams.windowLog);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */
    if ( (cdict)
      && (cdict->dictContentSize > 0)
      && ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
        || cdict->compressionLevel == 0)
      && (params->attachDictPref != ZSTD_dictForceLoad) ) {
        return ZSTD_resetCCtx_usingCDict(cctx, cdict, params, pledgedSrcSize, zbuff);
    }

    FORWARD_IF_ERROR( ZSTD_resetCCtx_internal(cctx, params, pledgedSrcSize,
                                     dictContentSize,
                                     ZSTDcrp_makeClean, zbuff) , "");
    {   size_t const dictID = cdict ?
                ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, cdict->dictContent,
                        cdict->dictContentSize, cdict->dictContentType, dtlm,
                        ZSTD_tfp_forCCtx, cctx->entropyWorkspace)
              : ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, dict, dictSize,
                        dictContentType, dtlm, ZSTD_tfp_forCCtx, cctx->entropyWorkspace);
        FORWARD_IF_ERROR(dictID, "ZSTD_compress_insertDictionary failed");
        assert(dictID <= UINT_MAX);
        cctx->dictID = (U32)dictID;
        cctx->dictContentSize = dictContentSize;
    }
    return 0;
}